

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_string *
pugi::impl::anon_unknown_0::string_value
          (xpath_string *__return_storage_ptr__,xpath_node *na,xpath_allocator *alloc)

{
  char *pcVar1;
  uint uVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  xml_node_struct **ppxVar5;
  xml_node_struct *pxVar6;
  bool bVar7;
  xpath_string local_48;
  
  pxVar6 = (xml_node_struct *)(na->_attribute)._attr;
  if (pxVar6 == (xml_node_struct *)0x0) {
    pxVar6 = (na->_node)._root;
    if (pxVar6 == (xml_node_struct *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (uint)pxVar6->header & 0xf;
    }
    pcVar1 = "";
    if (3 < uVar2 - 3) {
      if (uVar2 - 1 < 2) {
        __return_storage_ptr__->_buffer = "";
        __return_storage_ptr__->_uses_heap = false;
        __return_storage_ptr__->_length_heap = 0;
        pcVar1 = "";
        if (pxVar6 != (xml_node_struct *)0x0) {
          pcVar1 = "";
          if (pxVar6->value != (char *)0x0) {
            pcVar1 = pxVar6->value;
          }
        }
        if (*pcVar1 != '\0') {
          if (pxVar6 == (xml_node_struct *)0x0) {
            local_48._buffer = "";
          }
          else {
            local_48._buffer = "";
            if (pxVar6->value != (char *)0x0) {
              local_48._buffer = pxVar6->value;
            }
          }
          local_48._uses_heap = false;
          local_48._length_heap = 0;
          xpath_string::append(__return_storage_ptr__,&local_48,alloc);
        }
        if (pxVar6 == (xml_node_struct *)0x0) {
          pxVar3 = (xml_node_struct *)0x0;
        }
        else {
          pxVar3 = pxVar6->first_child;
        }
        if (pxVar3 == pxVar6 || pxVar3 == (xml_node_struct *)0x0) {
          return __return_storage_ptr__;
        }
        do {
          if (((pxVar3->header & 0xf) == 3) || ((pxVar3->header & 0xf) == 4)) {
            local_48._buffer = pxVar3->value;
            if (local_48._buffer == (char *)0x0) {
              local_48._buffer = "";
            }
            local_48._uses_heap = false;
            local_48._length_heap = 0;
            xpath_string::append(__return_storage_ptr__,&local_48,alloc);
          }
          if (pxVar3->first_child == (xml_node_struct *)0x0) {
            if (pxVar3->next_sibling != (xml_node_struct *)0x0) {
              ppxVar5 = &pxVar3->next_sibling;
              goto LAB_001337a3;
            }
            while( true ) {
              pxVar4 = pxVar3;
              if (pxVar4 == (xml_node_struct *)0x0) {
                bVar7 = true;
              }
              else {
                bVar7 = pxVar4->next_sibling == (xml_node_struct *)0x0;
              }
              if ((pxVar4 == pxVar6) || (!bVar7)) break;
              pxVar3 = (xml_node_struct *)0x0;
              if (pxVar4 != (xml_node_struct *)0x0) {
                pxVar3 = pxVar4->parent;
              }
            }
            pxVar3 = (xml_node_struct *)0x0;
            if (pxVar4 == pxVar6) {
              pxVar3 = pxVar4;
            }
            if (pxVar4 != pxVar6 && pxVar4 != (xml_node_struct *)0x0) {
              ppxVar5 = &pxVar4->next_sibling;
              goto LAB_001337a3;
            }
          }
          else {
            ppxVar5 = &pxVar3->first_child;
LAB_001337a3:
            pxVar3 = *ppxVar5;
          }
          if (pxVar3 == (xml_node_struct *)0x0) {
            return __return_storage_ptr__;
          }
          if (pxVar3 == pxVar6) {
            return __return_storage_ptr__;
          }
        } while( true );
      }
      goto LAB_0013360c;
    }
    if (pxVar6 == (xml_node_struct *)0x0) goto LAB_0013360c;
  }
  pcVar1 = "";
  if (pxVar6->value != (char *)0x0) {
    pcVar1 = pxVar6->value;
  }
LAB_0013360c:
  __return_storage_ptr__->_buffer = pcVar1;
  __return_storage_ptr__->_uses_heap = false;
  __return_storage_ptr__->_length_heap = 0;
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xpath_string string_value(const xpath_node& na, xpath_allocator* alloc)
	{
		if (na.attribute())
			return xpath_string::from_const(na.attribute().value());
		else
		{
			xml_node n = na.node();

			switch (n.type())
			{
			case node_pcdata:
			case node_cdata:
			case node_comment:
			case node_pi:
				return xpath_string::from_const(n.value());

			case node_document:
			case node_element:
			{
				xpath_string result;

				// element nodes can have value if parse_embed_pcdata was used
				if (n.value()[0])
					result.append(xpath_string::from_const(n.value()), alloc);

				xml_node cur = n.first_child();

				while (cur && cur != n)
				{
					if (cur.type() == node_pcdata || cur.type() == node_cdata)
						result.append(xpath_string::from_const(cur.value()), alloc);

					if (cur.first_child())
						cur = cur.first_child();
					else if (cur.next_sibling())
						cur = cur.next_sibling();
					else
					{
						while (!cur.next_sibling() && cur != n)
							cur = cur.parent();

						if (cur != n) cur = cur.next_sibling();
					}
				}

				return result;
			}

			default:
				return xpath_string();
			}
		}
	}